

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O3

bool_t memIsZero(void *buf,size_t count)

{
  size_t sVar1;
  ulong uVar2;
  
  uVar2 = 0;
  if (7 < count) {
    do {
      uVar2 = uVar2 | *buf;
      buf = (void *)((long)buf + 8);
      count = count - 8;
    } while (7 < count);
  }
  if (count != 0) {
    sVar1 = 0;
    do {
      uVar2 = uVar2 | *(byte *)((long)buf + sVar1);
      sVar1 = sVar1 + 1;
    } while (count != sVar1);
  }
  return (bool_t)(uVar2 == 0);
}

Assistant:

bool_t SAFE(memIsZero)(const void* buf, size_t count)
{
	register word diff = 0;
	ASSERT(memIsValid(buf, count));
	for (; count >= O_PER_W; count -= O_PER_W)
	{
		diff |= *(const word*)buf;
		buf = (const word*)buf + 1;
	}
	while (count--)
	{
		diff |= *(const octet*)buf;
		buf = (const octet*)buf + 1;
	}
	return (bool_t)wordEq(diff, 0);
}